

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint32 gau_begin_00;
  int iVar1;
  uint uVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *fn;
  char *mllrmatfn;
  char *cb2mllrfn;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint32 n_mgau_rd;
  uint32 n_feat_rd;
  uint32 n_mllr_class;
  uint32 n_density;
  uint32 n_mgau_rd_1;
  uint32 n_mgau;
  undefined4 uStack_9c;
  int32 *cb2mllr;
  vector_t ***mean;
  uint32 n_feat;
  uint32 *veclen;
  char *local_78;
  float32 ***B;
  uint32 *veclen_rd;
  float32 ****A;
  model_def_t *mdef;
  uint32 gau_begin;
  uint32 n_mllr_class_1;
  uint32 n_feat_rd_1;
  char *local_40;
  long local_38;
  
  printf("----- Compiled on %s, %s\n\n","Apr 25 2025","23:24:42");
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-outmeanfn");
  pcVar3 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar3,"-inmeanfn");
  pcVar3 = cmd_ln_get();
  pcVar6 = cmd_ln_str_r(pcVar3,"-outgaucntfn");
  pcVar3 = cmd_ln_get();
  fn = cmd_ln_str_r(pcVar3,"-ingaucntfn");
  pcVar3 = cmd_ln_get();
  mllrmatfn = cmd_ln_str_r(pcVar3,"-mllrmat");
  pcVar3 = cmd_ln_get();
  cb2mllrfn = cmd_ln_str_r(pcVar3,"-cb2mllrfn");
  pcVar3 = cmd_ln_get();
  local_40 = cmd_ln_str_r(pcVar3,"-moddeffn");
  pcVar3 = cmd_ln_get();
  local_38 = cmd_ln_int_r(pcVar3,"-cdonly");
  pcVar3 = cmd_ln_get();
  lVar7 = cmd_ln_int_r(pcVar3,"-inverse");
  if ((mllrmatfn == (char *)0x0) || (cb2mllrfn == (char *)0x0)) {
    pcVar5 = "You must specify all mllr files\n";
    lVar7 = 0x160;
LAB_00102df1:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,lVar7,pcVar5);
    goto LAB_00102d75;
  }
  if (pcVar4 == (char *)0x0) {
    local_78 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      pcVar5 = "No -outmeanfn or -outgaucntfn given, nothing done.\n";
      lVar7 = 0x183;
      goto LAB_00102df1;
    }
    mdef = (model_def_t *)0x0;
    mean = (vector_t ***)0x0;
    veclen = (uint32 *)0x0;
    veclen_rd = (uint32 *)0x0;
    cb2mllr = (int32 *)0x0;
    A = (float32 ****)0x0;
    B = (float32 ***)0x0;
    _n_mgau = (float32 ****)0x0;
    _n_feat = (float32 ***)0x0;
    read_mllr_files(mllrmatfn,cb2mllrfn,(float32 *****)&n_mgau,(float32 ****)&n_feat,(int32 **)&B,
                    &n_mllr_class_1,&n_mgau_rd,&n_feat_rd,(uint32 **)&cb2mllr,(uint32)lVar7);
    fputc(10,_stderr);
    iVar1 = s3gaucnt_read(fn,&mean,(vector_t ****)&veclen,(int32 *)&n_density,
                          (float32 ****)&veclen_rd,&n_mgau_rd_1,&n_feat_rd_1,&n_mllr_class,
                          (uint32 **)&A);
    pcVar5 = local_78;
    if (iVar1 == 0) {
      if (n_mgau_rd == 0) {
        n_mgau_rd = n_mgau_rd_1;
      }
      else if (n_mgau_rd_1 != n_mgau_rd) {
        lVar7 = 0x11b;
        uVar2 = n_mgau_rd_1;
        goto LAB_00102ab6;
      }
      uVar9 = (ulong)n_feat_rd_1;
      if (n_feat_rd_1 != n_feat_rd) {
        lVar7 = 0x11e;
        goto LAB_00102e32;
      }
      if (uVar9 != 0) {
        uVar8 = 0;
        do {
          uVar2 = *(uint *)((long)A + uVar8 * 4);
          if (uVar2 != cb2mllr[uVar8]) {
            lVar7 = 0x123;
            goto LAB_00102d66;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      ckd_free(A);
      gau_begin = 0;
      if ((int)local_38 != 0) {
        read_mdef(local_40,&mdef,&gau_begin,(int32 *)B);
      }
      fputc(10,_stderr);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,0x12e,"Adapt mean values.\n");
      mllr_transform_mean(mean,(vector_t ***)0x0,0,n_mgau_rd,n_feat_rd,n_mllr_class,
                          (uint32 *)cb2mllr,_n_mgau,_n_feat,(int32 *)B,n_mllr_class_1);
      fputc(10,_stderr);
      iVar1 = s3gaucnt_write(pcVar5,mean,(vector_t ***)veclen,n_density,(float32 ***)veclen_rd,
                             n_mgau_rd,n_feat_rd,n_mllr_class,(uint32 *)cb2mllr);
      if (iVar1 == 0) {
        lVar7 = 0x17a;
        goto LAB_00102d10;
      }
      pcVar4 = "Unable to write Gaussian counts to %s\n";
      lVar7 = 0x140;
    }
    else {
      pcVar4 = "Unable to read Gaussian counts from %s\n";
      lVar7 = 0x115;
      pcVar5 = fn;
    }
LAB_00102e57:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,lVar7,pcVar4,pcVar5);
  }
  else {
    mdef = (model_def_t *)0x0;
    mean = (vector_t ***)0x0;
    veclen = (uint32 *)0x0;
    veclen_rd = (uint32 *)0x0;
    cb2mllr = (int32 *)0x0;
    A = (float32 ****)0x0;
    B = (float32 ***)0x0;
    local_78 = pcVar4;
    read_mllr_files(mllrmatfn,cb2mllrfn,&A,&B,&cb2mllr,&n_mllr_class,&n_mgau,&n_feat,&veclen,
                    (uint32)lVar7);
    fputc(10,_stderr);
    iVar1 = s3gau_read(pcVar5,&mean,&n_mgau_rd,&n_feat_rd,&n_density,&veclen_rd);
    if (iVar1 != 0) {
      pcVar4 = "Unable to read Gaussian means from %s\n";
      lVar7 = 0xb7;
      goto LAB_00102e57;
    }
    if (n_mgau == 0) {
      _n_mgau = (float32 ****)CONCAT44(uStack_9c,n_mgau_rd);
LAB_00102ac5:
      uVar9 = (ulong)n_feat_rd;
      if (n_feat_rd == n_feat) {
        if (uVar9 != 0) {
          uVar8 = 0;
LAB_00102ae9:
          uVar2 = veclen_rd[uVar8];
          if (uVar2 == veclen[uVar8]) goto code_r0x00102af9;
          lVar7 = 0xc5;
LAB_00102d66:
          pcVar5 = "veclen inconsistent. (%u : %u)\n";
          uVar9 = (ulong)uVar2;
          goto LAB_00102d6e;
        }
LAB_00102b01:
        ckd_free(veclen_rd);
        n_mgau_rd_1 = 0;
        if ((int)local_38 != 0) {
          read_mdef(local_40,&mdef,&n_mgau_rd_1,cb2mllr);
        }
        gau_begin_00 = n_mgau_rd_1;
        fputc(10,_stderr);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                ,0xd0,"Adapt mean values.\n");
        mllr_transform_mean(mean,(vector_t ***)0x0,gau_begin_00,n_mgau,n_feat,n_density,veclen,A,B,
                            cb2mllr,n_mllr_class);
        fputc(10,_stderr);
        pcVar5 = local_78;
        iVar1 = s3gau_write(local_78,mean,n_mgau,n_feat,n_density,veclen);
        if (iVar1 == 0) {
          lVar7 = 0x16a;
LAB_00102d10:
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                  ,lVar7,"mllr_adapt finished successfully.\n");
          return 0;
        }
        pcVar4 = "Unable to write Gaussian means to %s\n";
        lVar7 = 0xdd;
        goto LAB_00102e57;
      }
      lVar7 = 0xc0;
LAB_00102e32:
      pcVar5 = "# feature stream inconsistent. (%u : %u)\n";
    }
    else {
      if (n_mgau_rd == n_mgau) goto LAB_00102ac5;
      lVar7 = 0xbd;
      uVar2 = n_mgau_rd;
LAB_00102ab6:
      uVar9 = (ulong)uVar2;
      pcVar5 = "# means %u inconsistent w/ cb2mllr # cb %u\n";
    }
LAB_00102d6e:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,lVar7,pcVar5,uVar9);
  }
LAB_00102d75:
  exit(1);
code_r0x00102af9:
  uVar8 = uVar8 + 1;
  if (uVar9 == uVar8) goto LAB_00102b01;
  goto LAB_00102ae9;
}

Assistant:

int
main(int argc, char *argv[])
{
    const char 	*outmeanfn, *inmeanfn;
    const char 	*outgaufn, *ingaufn;
    const char 	*mllrmatfn, *cb2mllrfn, *moddeffn;
    uint32     	cdonly, inverse;

    printf("----- Compiled on %s, %s\n\n",__DATE__,__TIME__);

    if (initialize(argc, argv) != S3_SUCCESS) {
	E_ERROR("Errors initializing.\n");
	return 0;
    }

    outmeanfn = cmd_ln_str("-outmeanfn");
    inmeanfn  = cmd_ln_str("-inmeanfn");
    outgaufn  = cmd_ln_str("-outgaucntfn");
    ingaufn   = cmd_ln_str("-ingaucntfn");
    mllrmatfn = cmd_ln_str("-mllrmat");
    cb2mllrfn = cmd_ln_str("-cb2mllrfn");
    moddeffn  = cmd_ln_str("-moddeffn");
    cdonly    = cmd_ln_int32("-cdonly");
    inverse   = cmd_ln_int32("-inverse");

    if (! (mllrmatfn && cb2mllrfn)) {
	E_FATAL("You must specify all mllr files\n");
    }
    if (outmeanfn) {
	if (mllr_adapt_mean(outmeanfn,
			    inmeanfn,
			    mllrmatfn,
			    cb2mllrfn,
			    moddeffn,
			    cdonly,
			    inverse) == S3_SUCCESS) {
	    E_INFO("mllr_adapt finished successfully.\n");
	    return(0);
	}
	else {
	    E_FATAL("Error in mllr_adapt_mean().\n");
	    return (1);
	}
    }
    else if (outgaufn) {
	if (mllr_adapt_gaucnt(outgaufn,
			      ingaufn,
			      mllrmatfn,
			      cb2mllrfn,
			      moddeffn,
			      cdonly,
			      inverse) == S3_SUCCESS) {
	    E_INFO("mllr_adapt finished successfully.\n");
	    return(0);
	}
	else {
	    E_FATAL("Error in mllr_adapt_mean().\n");
	    return (1);
	}
    }
    else {
	E_FATAL("No -outmeanfn or -outgaucntfn given, nothing done.\n");
    }
    return 0 ;
}